

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::WriteFile(Error *__return_storage_ptr__,string *aData,string *aFilename)

{
  int iVar1;
  string *psVar2;
  char *pcVar3;
  int *piVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  char *local_3d8;
  anon_class_1_0_00000001 local_3ca;
  v10 local_3c9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3c8;
  string local_3b8;
  Error local_398;
  char *local_370;
  anon_class_1_0_00000001 local_362;
  v10 local_361;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_360;
  string local_350;
  Error local_330;
  char *local_308;
  anon_class_1_0_00000001 local_2fa;
  v10 local_2f9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2f8;
  string local_2e8;
  Error local_2c8;
  FILE *local_290;
  FILE *f;
  string *local_280;
  string *aFilename_local;
  string *aData_local;
  Error *error;
  undefined1 local_240 [16];
  v10 *local_230;
  char *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  string *local_218;
  v10 *local_210;
  char *pcStack_208;
  string *local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_1f8;
  undefined1 local_1d0 [16];
  v10 *local_1c0;
  char *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  string *local_1a8;
  v10 *local_1a0;
  char *pcStack_198;
  string *local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_188;
  undefined1 local_168 [16];
  v10 *local_158;
  char *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  string *local_140;
  v10 *local_138;
  char *pcStack_130;
  string *local_128;
  v10 *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_118;
  v10 *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_108;
  v10 *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  v10 **local_b0;
  v10 *local_a8;
  char *pcStack_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_88;
  undefined1 *local_80;
  Error **local_78;
  undefined1 *local_70;
  Error **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_58;
  Error **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  f._7_1_ = 0;
  local_280 = aFilename;
  aFilename_local = aData;
  aData_local = (string *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_290 = fopen(pcVar3,"w");
  if (local_290 == (FILE *)0x0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (iVar1 == 0xd) {
      WriteFile::anon_class_1_0_00000001::operator()(&local_362);
      local_108 = &local_360;
      local_110 = &local_361;
      bVar5 = ::fmt::v10::operator()(local_110);
      local_360._8_8_ = bVar5.size_;
      local_360._M_allocated_capacity = (size_type)bVar5.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                ();
      psVar2 = local_280;
      piVar4 = __errno_location();
      local_370 = strerror(*piVar4);
      local_190 = &local_350;
      local_1a0 = (v10 *)local_360._M_allocated_capacity;
      pcStack_198 = (char *)local_360._8_8_;
      local_1a8 = psVar2;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370;
      local_d0 = &local_1a0;
      local_1c0 = (v10 *)local_360._M_allocated_capacity;
      local_1b8 = (char *)local_360._8_8_;
      local_c8 = local_1c0;
      pcStack_c0 = local_1b8;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                (&local_1f8,(v10 *)psVar2,local_1b0,(char **)local_360._M_allocated_capacity);
      local_80 = local_1d0;
      local_88 = &local_1f8;
      local_30 = 0xcd;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = local_1b8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_88;
      local_60 = local_88;
      local_38 = local_88;
      local_28 = local_80;
      ::fmt::v10::vformat_abi_cxx11_(&local_350,local_1c0,fmt_00,args_00);
      Error::Error(&local_330,kIOBusy,&local_350);
      Error::operator=(__return_storage_ptr__,&local_330);
      Error::~Error(&local_330);
      std::__cxx11::string::~string((string *)&local_350);
    }
    else if ((iVar1 == 0x11) || (iVar1 == 0x15)) {
      WriteFile::anon_class_1_0_00000001::operator()(&local_2fa);
      local_118 = &local_2f8;
      local_120 = &local_2f9;
      bVar5 = ::fmt::v10::operator()(local_120);
      local_2f8._8_8_ = bVar5.size_;
      local_2f8._M_allocated_capacity = (size_type)bVar5.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                ();
      psVar2 = local_280;
      piVar4 = __errno_location();
      local_308 = strerror(*piVar4);
      local_128 = &local_2e8;
      local_138 = (v10 *)local_2f8._M_allocated_capacity;
      pcStack_130 = (char *)local_2f8._8_8_;
      local_140 = psVar2;
      local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308;
      local_f0 = &local_138;
      local_158 = (v10 *)local_2f8._M_allocated_capacity;
      local_150 = (char *)local_2f8._8_8_;
      local_e8 = local_158;
      pcStack_e0 = local_150;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                (&local_188,(v10 *)psVar2,local_148,(char **)local_2f8._M_allocated_capacity);
      local_90 = local_168;
      local_98 = &local_188;
      local_18 = 0xcd;
      fmt.size_ = 0xcd;
      fmt.data_ = local_150;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_98;
      local_58 = local_98;
      local_20 = local_98;
      local_10 = local_90;
      ::fmt::v10::vformat_abi_cxx11_(&local_2e8,local_158,fmt,args);
      Error::Error(&local_2c8,kAlreadyExists,&local_2e8);
      Error::operator=(__return_storage_ptr__,&local_2c8);
      Error::~Error(&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    else {
      WriteFile::anon_class_1_0_00000001::operator()(&local_3ca);
      local_f8 = &local_3c8;
      local_100 = &local_3c9;
      bVar5 = ::fmt::v10::operator()(local_100);
      local_3c8._8_8_ = bVar5.size_;
      local_3c8._M_allocated_capacity = (size_type)bVar5.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                ();
      psVar2 = local_280;
      piVar4 = __errno_location();
      local_3d8 = strerror(*piVar4);
      local_200 = &local_3b8;
      local_210 = (v10 *)local_3c8._M_allocated_capacity;
      pcStack_208 = (char *)local_3c8._8_8_;
      local_218 = psVar2;
      local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8;
      local_b0 = &local_210;
      local_230 = (v10 *)local_3c8._M_allocated_capacity;
      local_228 = (char *)local_3c8._8_8_;
      local_a8 = local_230;
      pcStack_a0 = local_228;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                  *)&error,(v10 *)psVar2,local_220,(char **)local_3c8._M_allocated_capacity);
      local_70 = local_240;
      local_78 = &error;
      local_48 = 0xcd;
      fmt_01.size_ = 0xcd;
      fmt_01.data_ = local_228;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_78;
      local_68 = local_78;
      local_50 = local_78;
      local_40 = local_70;
      ::fmt::v10::vformat_abi_cxx11_(&local_3b8,local_230,fmt_01,args_01);
      Error::Error(&local_398,kIOError,&local_3b8);
      Error::operator=(__return_storage_ptr__,&local_398);
      Error::~Error(&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    fputs(pcVar3,local_290);
  }
  if (local_290 != (FILE *)0x0) {
    fclose(local_290);
  }
  return __return_storage_ptr__;
}

Assistant:

Error WriteFile(const std::string &aData, const std::string &aFilename)
{
    Error error;
    FILE *f = fopen(aFilename.c_str(), "w");

    if (f == nullptr)
    {
        switch (errno)
        {
        case EEXIST:
        case EISDIR:
            ExitNow(error = ERROR_ALREADY_EXISTS("path already exists '{}', {}", aFilename, strerror(errno)));
            break;

        case EACCES:
            ExitNow(error = ERROR_IO_BUSY("access denied on path '{}', {}", aFilename, strerror(errno)));
            break;

        default:
            ExitNow(error = ERROR_IO_ERROR("error on opening file '{}', {}", aFilename, strerror(errno)));
        }
    }

    fputs(aData.c_str(), f);

exit:
    if (f != nullptr)
    {
        fclose(f);
    }

    return error;
}